

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall MixSegmentTest_TestUserDict_Test::TestBody(MixSegmentTest_TestUserDict_Test *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  size_t j;
  size_t len;
  size_t i;
  string s;
  size_t MAX_LEN;
  size_t ITERATION;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  MixSegment segment;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  MixSegment *in_stack_fffffffffffffbe0;
  char (*in_stack_fffffffffffffbe8) [105];
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  string *in_stack_fffffffffffffbf8;
  string *this_00;
  string *in_stack_fffffffffffffc00;
  string *this_01;
  string *in_stack_fffffffffffffc08;
  Type TVar5;
  string *connector;
  MixSegment *in_stack_fffffffffffffc10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *in_stack_fffffffffffffc18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  Message *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  undefined1 uVar6;
  ulong local_378;
  ulong local_368;
  string local_360 [32];
  undefined8 local_340;
  undefined8 local_338;
  AssertionResult local_320;
  undefined1 local_309 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e0;
  string local_2d8 [39];
  undefined1 local_2b1 [49];
  AssertionResult local_280;
  allocator<char> local_269;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  AssertionResult local_238;
  allocator<char> local_221;
  string local_220 [36];
  uint local_1fc;
  AssertionResult local_1e8;
  allocator<char> local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  undefined1 local_190 [32];
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [55];
  allocator<char> local_111;
  string local_110 [272];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  cppjieba::MixSegment::MixSegment
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8);
  TVar5 = (Type)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)(local_190 + 0x1f));
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1c73ca);
  std::__cxx11::string::string(local_1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (allocator<char> *)in_stack_fffffffffffffc10);
  cppjieba::MixSegment::Cut
            (in_stack_fffffffffffffbe0,
             (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c7427);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  testing::internal::EqHelper<false>::Compare<char[61],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffbf8,
             (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
             (char (*) [61])in_stack_fffffffffffffbe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc10);
    testing::AssertionResult::failure_message((AssertionResult *)0x1c75fc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffc10,TVar5,(char *)in_stack_fffffffffffffc00,
               (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               in_stack_fffffffffffffc38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x1c7659);
  }
  local_1fc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c76c7);
  if (local_1fc == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
               (allocator<char> *)in_stack_fffffffffffffc10);
    cppjieba::MixSegment::Cut
              (in_stack_fffffffffffffbe0,
               (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1c7722);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    testing::internal::EqHelper<false>::Compare<char[105],std::__cxx11::string>
              ((char *)in_stack_fffffffffffffbf8,
               (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbe0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    uVar6 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffc10);
      in_stack_fffffffffffffc38 =
           (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1c7833);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffc10,TVar5,(char *)in_stack_fffffffffffffc00,
                 (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
                );
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
      testing::Message::~Message((Message *)0x1c7890);
    }
    local_1fc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c78fe);
    if (local_1fc == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                 (allocator<char> *)in_stack_fffffffffffffc10);
      cppjieba::MixSegment::Cut
                (in_stack_fffffffffffffbe0,
                 (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1c7959);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
      std::allocator<char>::~allocator(&local_269);
      std::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      testing::internal::EqHelper<false>::Compare<char[29],std::__cxx11::string>
                ((char *)in_stack_fffffffffffffbf8,
                 (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                 (char (*) [29])in_stack_fffffffffffffbe8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbe0);
      iVar3 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffc10);
        in_stack_fffffffffffffc20 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x1c7a6a);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffc10,TVar5,(char *)in_stack_fffffffffffffc00
                   ,iVar3,(char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc40),
                   in_stack_fffffffffffffc38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
        testing::Message::~Message((Message *)0x1c7ac7);
      }
      local_1fc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c7b35);
      if (local_1fc == 0) {
        begin._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc20,(char *)begin._M_current,
                   (allocator<char> *)in_stack_fffffffffffffc10);
        cppjieba::MixSegment::Cut
                  (in_stack_fffffffffffffbe0,
                   (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1c7b90);
        std::__cxx11::string::~string((string *)(local_2b1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2b1);
        connector = (string *)local_190;
        local_2e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
        local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
        end._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_309;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc20,(char *)begin._M_current,
                   (allocator<char> *)end._M_current);
        limonp::
        Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (begin,end,connector);
        TVar5 = (Type)((ulong)connector >> 0x20);
        this_01 = local_1b0;
        this_00 = local_2d8;
        std::__cxx11::string::operator=(this_01,this_00);
        std::__cxx11::string::~string(this_00);
        std::__cxx11::string::~string((string *)(local_309 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_309);
        testing::internal::EqHelper<false>::Compare<char[51],std::__cxx11::string>
                  ((char *)this_00,
                   (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                   (char (*) [51])in_stack_fffffffffffffbe8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbe0);
        iVar3 = (int)((ulong)this_00 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
        in_stack_fffffffffffffbf7 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)end._M_current);
          testing::AssertionResult::failure_message((AssertionResult *)0x1c7d96);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)end._M_current,TVar5,(char *)this_01,iVar3,
                     (char *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT17(uVar6,in_stack_fffffffffffffc40),
                     in_stack_fffffffffffffc38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
          testing::Message::~Message((Message *)0x1c7df3);
        }
        local_1fc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c7e61);
        if (local_1fc == 0) {
          local_338 = 0x10;
          local_340 = 0x100;
          std::__cxx11::string::string(local_360);
          tVar4 = time((time_t *)0x0);
          srand((uint)tVar4);
          for (local_368 = 0; local_368 < 0x10; local_368 = local_368 + 1) {
            uVar2 = rand();
            std::__cxx11::string::resize((ulong)local_360);
            for (local_378 = 0; local_378 < (uVar2 & 0xff); local_378 = local_378 + 1) {
              iVar3 = rand();
              in_stack_fffffffffffffbdf = (undefined1)iVar3;
              rand();
              in_stack_fffffffffffffbe0 =
                   (MixSegment *)std::__cxx11::string::operator[]((ulong)local_360);
              *(undefined1 *)
               &(in_stack_fffffffffffffbe0->super_SegmentTagged).super_SegmentBase._vptr_SegmentBase
                   = in_stack_fffffffffffffbdf;
            }
            cppjieba::MixSegment::Cut
                      (in_stack_fffffffffffffbe0,
                       (string *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1c7fb5);
          }
          std::__cxx11::string::~string(local_360);
          local_1fc = 0;
        }
      }
    }
  }
  std::__cxx11::string::~string(local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  cppjieba::MixSegment::~MixSegment(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

TEST(MixSegmentTest, TestUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", 
        "../test/testdata/userdict.utf8");
  vector<string> words;
  string res;

  segment.Cut("令狐冲是云计算方面的专家", words);
  ASSERT_EQ("[\"令狐冲\", \"是\", \"云计算\", \"方面\", \"的\", \"专家\"]", res << words);

  segment.Cut("小明先就职于IBM,后在日本京都大学深造", words);
  res << words;
  ASSERT_EQ("[\"小明\", \"先\", \"就职\", \"于\", \"I\", \"B\", \"M\", \",\", \"后\", \"在\", \"日本\", \"京都大学\", \"深造\"]", res);

  segment.Cut("IBM,3.14", words);
  res << words;
  ASSERT_EQ("[\"I\", \"B\", \"M\", \",\", \"3.14\"]", res);

  segment.Cut("忽如一夜春风来，千树万树梨花开", words);
  res = limonp::Join(words.begin(), words.end(), "/");
  ASSERT_EQ("忽如一夜春风来/，/千树/万树/梨花/开", res);

  // rand input
  {
    const size_t ITERATION = 16;
    const size_t MAX_LEN = 256;
    string s;
    srand(time(NULL));

    for (size_t i = 0; i < ITERATION; i++) {
      size_t len = rand() % MAX_LEN;
      s.resize(len);
      for (size_t j = 0; j < len; j++) {
        s[rand() % len] = rand();
      }
      segment.Cut(s, words);
    }
  }
}